

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_combo_callback(nk_context *ctx,_func_void_void_ptr_int_char_ptr_ptr *item_getter,
                     void *userdata,int selected,int count,int item_height,nk_vec2 size)

{
  nk_vec2 nVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  char *item;
  int local_64;
  char *local_60;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x61c3,
                  "int nk_combo_callback(struct nk_context *, void (*)(void *, int, const char **), void *, int, int, int, struct nk_vec2)"
                 );
  }
  local_58._8_4_ = in_XMM0_Dc;
  local_58._0_8_ = size;
  local_58._12_4_ = in_XMM0_Dd;
  if (item_getter != (_func_void_void_ptr_int_char_ptr_ptr *)0x0) {
    iVar4 = (int)(ctx->style).window.spacing.y;
    nVar1 = nk_panel_get_padding(&ctx->style,ctx->current->layout->type);
    fVar5 = (float)((iVar4 + item_height) * count + ((int)nVar1.y + iVar4) * 2);
    local_48 = (float)local_58._4_4_;
    if (fVar5 <= (float)local_58._4_4_) {
      local_48 = fVar5;
    }
    fStack_44 = (float)local_58._4_4_;
    fStack_40 = (float)local_58._4_4_;
    fStack_3c = (float)local_58._4_4_;
    (*item_getter)(userdata,selected,&local_60);
    pcVar2 = local_60;
    iVar4 = nk_strlen(local_60);
    nVar1.y = local_48;
    nVar1.x = (float)local_58._0_4_;
    iVar4 = nk_combo_begin_text(ctx,pcVar2,iVar4,nVar1);
    local_64 = selected;
    if (iVar4 != 0) {
      iVar4 = 0;
      nk_row_layout(ctx,NK_DYNAMIC,(float)item_height,1,0);
      if (0 < count) {
        do {
          (*item_getter)(userdata,iVar4,&local_60);
          pcVar2 = local_60;
          iVar3 = nk_strlen(local_60);
          iVar3 = nk_contextual_item_text(ctx,pcVar2,iVar3,0x11);
          if (iVar3 != 0) {
            local_64 = iVar4;
          }
          iVar4 = iVar4 + 1;
        } while (count != iVar4);
      }
      nk_contextual_end(ctx);
    }
    return local_64;
  }
  __assert_fail("item_getter",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                ,0x61c4,
                "int nk_combo_callback(struct nk_context *, void (*)(void *, int, const char **), void *, int, int, int, struct nk_vec2)"
               );
}

Assistant:

NK_API int
nk_combo_callback(struct nk_context *ctx, void(*item_getter)(void*, int, const char**),
    void *userdata, int selected, int count, int item_height, struct nk_vec2 size)
{
    int i;
    int max_height;
    struct nk_vec2 item_spacing;
    struct nk_vec2 window_padding;
    const char *item;

    NK_ASSERT(ctx);
    NK_ASSERT(item_getter);
    if (!ctx || !item_getter)
        return selected;

    /* calculate popup window */
    item_spacing = ctx->style.window.spacing;
    window_padding = nk_panel_get_padding(&ctx->style, ctx->current->layout->type);
    max_height = count * item_height + count * (int)item_spacing.y;
    max_height += (int)item_spacing.y * 2 + (int)window_padding.y * 2;
    size.y = NK_MIN(size.y, (float)max_height);

    item_getter(userdata, selected, &item);
    if (nk_combo_begin_label(ctx, item, size)) {
        nk_layout_row_dynamic(ctx, (float)item_height, 1);
        for (i = 0; i < count; ++i) {
            item_getter(userdata, i, &item);
            if (nk_combo_item_label(ctx, item, NK_TEXT_LEFT))
                selected = i;
        }
        nk_combo_end(ctx);
    } return selected;
}